

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer_combination_iterator.h
# Opt level: O2

void __thiscall
Gudhi::coxeter_triangulation::Integer_combination_iterator::
Integer_combination_iterator<Gudhi::coxeter_triangulation::Size_range<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
          (Integer_combination_iterator *this,uint *n,uint *k,
          Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *bounds)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  iterator __begin0;
  iterator __end0;
  uint local_7c;
  iterator local_78;
  uint *local_58;
  iterator local_50;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->value_,(ulong)(*k + 2),(allocator_type *)&local_78);
  uVar2 = *k;
  this->is_end_ = uVar2 == 0 || *n == 0;
  this->k_ = uVar2;
  this_00 = &this->bounds_;
  (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_00,(ulong)(*k + 2));
  Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::begin(&local_78,bounds);
  local_58 = n;
  Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::end(&local_50,bounds);
  uVar7 = 0;
  while ((local_78.is_end_ != true || ((local_50.is_end_ & 1U) == 0))) {
    uVar5 = (uint)local_78.value_;
    local_7c = (uint)local_78.value_;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,&local_7c);
    uVar7 = uVar7 + uVar5;
    pvVar1 = local_78.t_it_._M_current + 1;
    if (pvVar1 == local_78.t_end_._M_current) {
      local_78.is_end_ = true;
      local_78.t_it_._M_current = pvVar1;
    }
    else {
      local_78.value_ =
           ((long)local_78.t_it_._M_current[1].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_78.t_it_._M_current[1].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) - 1;
      local_78.t_it_._M_current = pvVar1;
    }
  }
  local_78.t_it_._M_current._0_4_ = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this_00,(uint *)&local_78);
  local_78.t_it_._M_current._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this_00,(uint *)&local_78);
  uVar5 = *local_58;
  if (uVar7 < uVar5) {
    this->is_end_ = true;
  }
  else {
    puVar3 = (this->value_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar6 = 0;
    while( true ) {
      uVar7 = puVar4[uVar6];
      if (uVar5 < uVar7) break;
      puVar3[uVar6] = uVar7;
      uVar5 = uVar5 - puVar4[uVar6];
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    puVar3 = (this->value_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      puVar3[uVar6] = uVar5;
      uVar7 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar7;
      uVar5 = 0;
    } while (uVar7 < this->k_);
    puVar3[*k] = 1;
    puVar3[*k + 1] = 0;
  }
  return;
}

Assistant:

Integer_combination_iterator(const uint& n, const uint& k, const Bound_range& bounds)
	  : value_(k + 2), is_end_(n == 0 || k == 0), k_(k) {
    bounds_.reserve(k + 2);
    uint sum_radices = 0;
    for (auto b : bounds) {
      bounds_.push_back(b);
      sum_radices += b;
    }
    bounds_.push_back(2);
    bounds_.push_back(1);
    if (n > sum_radices) {
      is_end_ = true;
      return;
    }
    uint i = 0;
    uint s = n;
    while (s >= bounds_[i]) {
      value_[i] = bounds_[i];
      s -= bounds_[i];
      i++;
    }
    value_[i++] = s;

    while (i < k_) value_[i++] = 0;
    value_[k] = 1;
    value_[k + 1] = 0;
  }